

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::inverse(mat3 *__return_storage_ptr__,mat3 *m)

{
  float_t fVar1;
  mat3 local_3c;
  
  fVar1 = determinant(m);
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    __assert_fail("det != float_t(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_algebra/dj_algebra.h"
                  ,0x250,"mat3 dja::inverse(const mat3 &)");
  }
  adjugate(&local_3c,m);
  operator*(__return_storage_ptr__,1.0 / fVar1,&local_3c);
  return __return_storage_ptr__;
}

Assistant:

mat3 inverse(const mat3& m)
{
    float_t det = determinant(m);
    DJA_ASSERT(det != float_t(0));

    return (float_t(1) / det) * adjugate(m);
}